

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::LinearDerivateCase
          (LinearDerivateCase *this,TestContext *testCtx,string *name,string *description,
          DerivateFunc func,DataType type,Precision precision,SurfaceType surfaceType,int numSamples
          ,string *fragmentSrcTmpl,BaseUniformType usedDefaultUniform)

{
  UniformSetup *uniformSetup;
  DataType type_local;
  DerivateFunc func_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  LinearDerivateCase *this_local;
  
  uniformSetup = (UniformSetup *)operator_new(0x18);
  LinearDerivateUniformSetup::LinearDerivateUniformSetup
            ((LinearDerivateUniformSetup *)uniformSetup,false,usedDefaultUniform);
  TriangleDerivateCase::TriangleDerivateCase
            (&this->super_TriangleDerivateCase,testCtx,name,description,uniformSetup);
  (this->super_TriangleDerivateCase).super_ShaderRenderCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__LinearDerivateCase_016648d0;
  std::__cxx11::string::string((string *)&this->m_fragmentTmpl,(string *)fragmentSrcTmpl);
  (this->super_TriangleDerivateCase).m_definitions.func = func;
  (this->super_TriangleDerivateCase).m_definitions.dataType = type;
  (this->super_TriangleDerivateCase).m_definitions.precision = precision;
  (this->super_TriangleDerivateCase).m_definitions.coordDataType =
       (this->super_TriangleDerivateCase).m_definitions.dataType;
  (this->super_TriangleDerivateCase).m_definitions.coordPrecision =
       (this->super_TriangleDerivateCase).m_definitions.precision;
  (this->super_TriangleDerivateCase).m_definitions.surfaceType = surfaceType;
  (this->super_TriangleDerivateCase).m_definitions.numSamples = numSamples;
  return;
}

Assistant:

LinearDerivateCase::LinearDerivateCase (tcu::TestContext&		testCtx,
										const std::string&		name,
										const std::string&		description,
										DerivateFunc			func,
										glu::DataType			type,
										glu::Precision			precision,
										SurfaceType				surfaceType,
										int						numSamples,
										const std::string&		fragmentSrcTmpl,
										BaseUniformType			usedDefaultUniform)
	: TriangleDerivateCase	(testCtx, name, description, new LinearDerivateUniformSetup(false, usedDefaultUniform))
	, m_fragmentTmpl		(fragmentSrcTmpl)
{
	m_definitions.func				= func;
	m_definitions.dataType			= type;
	m_definitions.precision			= precision;
	m_definitions.coordDataType		= m_definitions.dataType;
	m_definitions.coordPrecision	= m_definitions.precision;
	m_definitions.surfaceType		= surfaceType;
	m_definitions.numSamples		= numSamples;
}